

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O0

void __thiscall
amrex::StateDescriptor::define
          (StateDescriptor *this,IndexType btyp,TimeCenter ttyp,int ident,int nextra,int num_comp,
          InterpBase *a_interp,bool a_extrap,bool a_store_in_checkpoint)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  pointer in_stack_00000008;
  byte in_stack_00000010;
  
  *(undefined4 *)
   &(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)&in_RDI->super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>)->_M_impl).
    super__Vector_impl_data._M_start = in_ESI;
  *(undefined4 *)
   ((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&in_RDI->super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>)->_M_impl).
           super__Vector_impl_data._M_start + 4) = in_EDX;
  *(undefined4 *)
   &(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)&in_RDI->super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>)->_M_impl).
    super__Vector_impl_data._M_finish = in_ECX;
  *(undefined4 *)
   &(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)&in_RDI->super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>)->_M_impl).
    super__Vector_impl_data._M_end_of_storage = in_R8D;
  *(undefined4 *)
   ((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&in_RDI->super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>)->_M_impl).
           super__Vector_impl_data._M_finish + 4) = in_R9D;
  (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     *)&in_RDI[1].super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>)->_M_impl).
  super__Vector_impl_data._M_start = in_stack_00000008;
  *(byte *)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&in_RDI[1].super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>)->
            _M_impl).super__Vector_impl_data._M_finish = in_stack_00000010 & 1;
  *(byte *)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&in_RDI[1].super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>)
                   ->_M_impl).super__Vector_impl_data._M_finish + 1) = (byte)num_comp & 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RDI,CONCAT44(in_EDX,in_ECX));
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::resize(in_RDI,CONCAT44(in_EDX,in_ECX));
  std::
  vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
  ::resize((vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
            *)in_RDI,CONCAT44(in_EDX,in_ECX));
  std::vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>::resize
            ((vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_> *)in_RDI,
             CONCAT44(in_EDX,in_ECX));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_RDI,CONCAT44(in_EDX,in_ECX));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_RDI,CONCAT44(in_EDX,in_ECX));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_RDI,CONCAT44(in_EDX,in_ECX));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_RDI,CONCAT44(in_EDX,in_ECX));
  return;
}

Assistant:

void
StateDescriptor::define (IndexType                   btyp,
                         StateDescriptor::TimeCenter ttyp,
                         int                         ident,
                         int                         nextra,
                         int                         num_comp,
                         InterpBase*                 a_interp,
                         bool                        a_extrap,
                         bool                        a_store_in_checkpoint)
{
    type     = btyp;
    t_type   = ttyp;
    id       = ident;
    ngrow    = nextra;
    ncomp    = num_comp;
    mapper   = a_interp;
    m_extrap = a_extrap;
    m_store_in_checkpoint = a_store_in_checkpoint;

    BL_ASSERT (num_comp > 0);

    names.resize(num_comp);
    bc.resize(num_comp);
    bc_func.resize(num_comp);
    mapper_comp.resize(num_comp);
    m_primary.resize(num_comp);
    m_groupsize.resize(num_comp);
    max_map_start_comp.resize(num_comp);
    min_map_end_comp.resize(num_comp);
}